

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_0::TestExceptionCallback::logMessage
          (TestExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  size_t sVar1;
  ArrayDisposer *pAVar2;
  ProcessContext *pPVar3;
  String *params_1;
  char *pcVar4;
  String *params_3;
  ArrayPtr<void_*const> AVar5;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> trace;
  void *traceSpace [32];
  String *in_stack_fffffffffffffe60;
  String local_198;
  int local_17c;
  String local_178;
  String local_158;
  char *local_140;
  void **local_138;
  void **ppvVar6;
  size_t in_stack_fffffffffffffed8;
  
  space.size_ = 2;
  space.ptr = (void **)0x20;
  local_17c = line;
  local_140 = file;
  AVar5 = getStackTrace((kj *)&stack0xfffffffffffffed8,space,line);
  local_138 = AVar5.ptr;
  ppvVar6 = (void **)AVar5.size_;
  if ((text->content).size_ < 2) {
    heapString(&local_198,"expectation failed",0x12);
    pcVar4 = (text->content).ptr;
    if (pcVar4 != (char *)0x0) {
      sVar1 = (text->content).size_;
      pAVar2 = (text->content).disposer;
      (text->content).ptr = (char *)0x0;
      (text->content).size_ = 0;
      (*(code *)**(undefined8 **)pAVar2)(pAVar2,pcVar4,1,sVar1,sVar1,0);
    }
    (text->content).ptr = local_198.content.ptr;
    (text->content).size_ = local_198.content.size_;
    (text->content).disposer = local_198.content.disposer;
  }
  local_158.content.size_ = (size_t)contextDepth;
  local_158.content.ptr = (char *)CONCAT71(local_158.content.ptr._1_7_,0x5f);
  params_1 = &local_178;
  local_178.content.ptr = (char *)CONCAT71(local_178.content.ptr._1_7_,0x3a);
  params_3 = (String *)0x31b3ed;
  str<kj::Repeat<char>,char_const*&,char,int&,char_const(&)[3],kj::String>
            (&local_198,(kj *)&local_158,(Repeat<char> *)&local_140,(char **)params_1,
             (char *)&local_17c,(int *)0x31b3ed,(char (*) [3])text,in_stack_fffffffffffffe60);
  pcVar4 = (text->content).ptr;
  if (pcVar4 != (char *)0x0) {
    params_1 = (String *)(text->content).size_;
    pAVar2 = (text->content).disposer;
    (text->content).ptr = (char *)0x0;
    (text->content).size_ = 0;
    params_3 = (String *)0x0;
    (*(code *)**(undefined8 **)pAVar2)(pAVar2,pcVar4,1,params_1,params_1);
  }
  (text->content).ptr = local_198.content.ptr;
  (text->content).size_ = local_198.content.size_;
  (text->content).disposer = local_198.content.disposer;
  if ((severity & ~WARNING) == ERROR) {
    this->sawError = true;
    pPVar3 = this->context;
    strArray<kj::ArrayPtr<void*const>&>
              (&local_158,(kj *)&local_138,(ArrayPtr<void_*const> *)0x31b137,(char *)params_1);
    AVar5.size_ = in_stack_fffffffffffffed8;
    AVar5.ptr = ppvVar6;
    stringifyStackTrace(AVar5);
    str<kj::String&,char_const(&)[9],kj::String,kj::String>
              (&local_198,(kj *)text,(String *)0x31c52f,(char (*) [9])&local_158,&local_178,params_3
              );
    pcVar4 = local_198.content.ptr;
    if (local_198.content.size_ == 0) {
      pcVar4 = "";
    }
    (*pPVar3->_vptr_ProcessContext[3])
              (pPVar3,pcVar4,local_198.content.size_ + (local_198.content.size_ == 0));
    sVar1 = local_198.content.size_;
    pcVar4 = local_198.content.ptr;
    if (local_198.content.ptr != (char *)0x0) {
      local_198.content.ptr = (char *)0x0;
      local_198.content.size_ = 0;
      (*(code *)**(undefined8 **)local_198.content.disposer)
                (local_198.content.disposer,pcVar4,1,sVar1,sVar1,0);
    }
    sVar1 = local_178.content.size_;
    pcVar4 = local_178.content.ptr;
    if (local_178.content.ptr != (char *)0x0) {
      local_178.content.ptr = (char *)0x0;
      local_178.content.size_ = 0;
      (*(code *)**(undefined8 **)local_178.content.disposer)
                (local_178.content.disposer,pcVar4,1,sVar1,sVar1,0);
    }
    sVar1 = local_158.content.size_;
    pcVar4 = local_158.content.ptr;
    if (local_158.content.ptr != (char *)0x0) {
      local_158.content.ptr = (char *)0x0;
      local_158.content.size_ = 0;
      (*(code *)**(undefined8 **)local_158.content.disposer)
                (local_158.content.disposer,pcVar4,1,sVar1,sVar1,0);
    }
  }
  else {
    if (local_198.content.size_ == 0) {
      local_198.content.ptr = "";
    }
    (*this->context->_vptr_ProcessContext[2])
              (this->context,local_198.content.ptr,
               local_198.content.size_ + (local_198.content.size_ == 0));
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    void* traceSpace[32];
    auto trace = getStackTrace(traceSpace, 2);

    if (text.size() == 0) {
      text = kj::heapString("expectation failed");
    }

    text = kj::str(kj::repeat('_', contextDepth), file, ':', line, ": ", kj::mv(text));

    if (severity == LogSeverity::ERROR || severity == LogSeverity::FATAL) {
      sawError = true;
      context.error(kj::str(text, "\nstack: ", strArray(trace, " "), stringifyStackTrace(trace)));
    } else {
      context.warning(text);
    }
  }